

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommand
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *command,
          size_t initialSkipCount,bool definition)

{
  bool bVar1;
  pointer ppVar2;
  string local_70;
  _Self local_50;
  _Self local_48;
  const_iterator commandIt;
  bool definition_local;
  size_t initialSkipCount_local;
  string *command_local;
  VulkanHppGenerator *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::contains(&this->m_RAIISpecialFunctions,command);
  if (!bVar1) {
    local_48._M_node =
         (_Base_ptr)
         anon_unknown.dwarf_b1723::findByNameOrAlias<VulkanHppGenerator::CommandData>
                   (&this->m_commands,command);
    local_50._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>_>
         ::end(&this->m_commands);
    bVar1 = std::operator==(&local_48,&local_50);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("commandIt != m_commands.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2357,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommand(const std::string &, size_t, bool) const"
                   );
    }
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_VulkanHppGenerator::CommandData>_>
             ::operator->(&local_48);
    generateCommand(&local_70,this,command,&ppVar2->second,initialSkipCount,definition,true);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommand( std::string const & command, size_t initialSkipCount, bool definition ) const
{
  std::string str;
  if ( !m_RAIISpecialFunctions.contains( command ) )
  {
    auto commandIt = findByNameOrAlias( m_commands, command );
    assert( commandIt != m_commands.end() );
    str = generateCommand( command, commandIt->second, initialSkipCount, definition, true );
  }
  return str;
}